

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O3

uint32_t helper_madd32_ssov(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2,
                           target_ulong_conflict r3)

{
  uint32_t uVar1;
  long lVar2;
  uint uVar3;
  
  lVar2 = (long)(int)r3 * (long)(int)r1 + (long)(int)r2;
  uVar3 = (uint)lVar2;
  if (lVar2 < 0x80000000) {
    if (lVar2 < -0x80000000) {
      env->PSW_USB_V = 0x80000000;
      env->PSW_USB_SV = 0x80000000;
      uVar1 = 0x80000000;
    }
    else {
      env->PSW_USB_V = 0;
      uVar1 = uVar3;
    }
  }
  else {
    env->PSW_USB_V = 0x80000000;
    env->PSW_USB_SV = 0x80000000;
    uVar1 = 0x7fffffff;
  }
  uVar3 = uVar3 * 2 ^ uVar3;
  env->PSW_USB_AV = uVar3;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar3;
  return uVar1;
}

Assistant:

static inline int64_t sextract64(uint64_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 64 - start);
    /* Note that this implementation relies on right shift of signed
     * integers being an arithmetic shift.
     */
    return ((int64_t)(value << (64 - length - start))) >> (64 - length);
}